

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTcPrsOpIf::parse(CTcPrsOpIf *this)

{
  int iVar1;
  CTcPrsNode *pCVar2;
  CTcPrsNode *pCVar3;
  CTcPrsNode *pCVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcPrsNode *pCVar5;
  size_t in_RSI;
  
  pCVar2 = CTcPrsOpIfnil::parse((CTcPrsOpIfnil *)this);
  if (pCVar2 != (CTcPrsNode *)0x0) {
    if ((G_tok->curtok_).typ_ != TOKT_QUESTION) {
      return pCVar2;
    }
    CTcTokenizer::next(G_tok);
    pCVar3 = CTcPrsOpBin::parse(&S_op_comma.super_CTcPrsOpBin);
    if ((pCVar3 != (CTcPrsNode *)0x0) &&
       (((G_tok->curtok_).typ_ == TOKT_COLON ||
        (CTcTokenizer::log_error(0x2afd), (G_tok->curtok_).typ_ != TOKT_EOF)))) {
      CTcTokenizer::next(G_tok);
      pCVar4 = CTcPrsOpAsi::parse(&S_op_asi);
      if (pCVar4 != (CTcPrsNode *)0x0) {
        iVar1 = (*(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(pCVar2);
        if (CONCAT44(extraout_var,iVar1) == 0) {
          pCVar5 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x20,in_RSI);
          pCVar5[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar2;
          pCVar5[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar3;
          pCVar5[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar4;
          (pCVar5->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00353810
          ;
          return pCVar5;
        }
        iVar1 = (*(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(pCVar2);
        iVar1 = CTcConstVal::get_val_bool((CTcConstVal *)CONCAT44(extraout_var_00,iVar1));
        if (iVar1 != 0) {
          return pCVar3;
        }
        return pCVar4;
      }
    }
  }
  return (CTcPrsNode *)0x0;
}

Assistant:

CTcPrsNode *CTcPrsOpIf::parse() const
{
    /* parse the conditional part */
    CTcPrsNode *first = S_op_ifnil.parse();
    if (first == 0)
        return 0;

    /* if we're not looking at the '?' operator, we're done */
    if (G_tok->cur() != TOKT_QUESTION)
        return first;

    /* skip the '?' operator */
    G_tok->next();

    /* 
     *   parse the second part, which can be any expression, including a
     *   double-quoted string expression or a comma expression (even though
     *   the '?:' operator overall has higher precedence than ',', we can't
     *   steal away operands from a ',' before our ':' because that would
     *   leave the ':' with nothing to go with) 
     */
    CTcPrsNode *second = G_prs->parse_expr_or_dstr(TRUE);
    if (second == 0)
        return 0;
    
    /* make sure we have the ':' after the second part */
    if (G_tok->cur() != TOKT_COLON)
    {
        /* 
         *   log the error, but continue parsing as though we found the
         *   ':' - if the ':' is simply missing, this will allow us to
         *   recover and continue parsing the rest of the expression 
         */
        G_tok->log_error(TCERR_QUEST_WITHOUT_COLON);

        /* if we're at the end of file, there's no point in continuing */
        if (G_tok->cur() == TOKT_EOF)
            return 0;
    }
    
    /* skip the ':' */
    G_tok->next();
    
    /* 
     *   parse the third part, which can be any other expression, including a
     *   double-quoted string expression - but not a comma expression, since
     *   we have higher precedence than ',' 
     */
    CTcPrsNode *third = G_prs->parse_expr_or_dstr(FALSE);
    if (third == 0)
        return 0;
        
    /* 
     *   If the condition is constant, we can choose the second or third
     *   expression directly.  It doesn't matter whether or not the second
     *   and/or third parts are themselves constant, because a constant
     *   condition means that we'll always execute only one of the
     *   alternatives.  
     */
    if (first->is_const())
    {
        /* 
         *   evaluate the conditional value as a true/false value, and
         *   return the second part's constant if the condition is true,
         *   or the third part's constant if the condition is false 
         */
        return (first->get_const_val()->get_val_bool()
                ? second : third);
    }
    else
    {
        /* it's not a constant value - return a new conditional node */
        return new CTPNIf(first, second, third);
    }
}